

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

bool jsoncons::detail::dtoa_general<jsoncons::string_sink<std::__cxx11::string>>
               (double v,char decimal_point,
               string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *result)

{
  bool bVar1;
  int k;
  int length;
  double local_88;
  char buffer [100];
  
  if ((v != 0.0) || (NAN(v))) {
    length = 0;
    local_88 = v;
    bVar1 = grisu3(ABS(v),buffer,&length,&k);
    if (!bVar1) {
      bVar1 = dtoa_general<jsoncons::string_sink<std::__cxx11::string>>
                        (local_88,(int)decimal_point,result);
      return bVar1;
    }
    if ((long)local_88 < 0) {
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back(result,'-');
    }
    prettify_string<jsoncons::string_sink<std::__cxx11::string>>
              (buffer,(long)length,k,-4,0x11,result);
  }
  else {
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(result,'0');
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(result,'.');
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(result,'0');
  }
  return true;
}

Assistant:

bool dtoa_general(double v, char decimal_point, Result& result, std::true_type)
    {
        if (v == 0)
        {
            result.push_back('0');
            result.push_back('.');
            result.push_back('0');
            return true;
        }

        int length = 0;
        int k;

        char buffer[100];

        double u = std::signbit(v) ? -v : v;
        if (jsoncons::detail::grisu3(u, buffer, &length, &k))
        {
            if (std::signbit(v))
            {
                result.push_back('-');
            }
            // min exp: -4 is consistent with sprintf
            // max exp: std::numeric_limits<double>::max_digits10
            jsoncons::detail::prettify_string(buffer, length, k, -4, std::numeric_limits<double>::max_digits10, result);
            return true;
        }
        else
        {
            return dtoa_general(v, decimal_point, result, std::false_type());
        }
    }